

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdcTable.c
# Opt level: O1

void Bdc_TableAdd(Bdc_Man_t *p,Bdc_Fun_t *pFunc)

{
  uint uVar1;
  uint uVar2;
  Vec_Int_t *pVVar3;
  Bdc_Fun_t **ppBVar4;
  int *piVar5;
  int iVar6;
  
  uVar1 = pFunc->uSupp;
  if (p->pTable[uVar1] != (Bdc_Fun_t *)0x0) goto LAB_005c35c5;
  pVVar3 = p->vSpots;
  uVar2 = pVVar3->nCap;
  if (pVVar3->nSize == uVar2) {
    if ((int)uVar2 < 0x10) {
      if (pVVar3->pArray == (int *)0x0) {
        piVar5 = (int *)malloc(0x40);
      }
      else {
        piVar5 = (int *)realloc(pVVar3->pArray,0x40);
      }
      pVVar3->pArray = piVar5;
      iVar6 = 0x10;
    }
    else {
      iVar6 = uVar2 * 2;
      if (iVar6 <= (int)uVar2) goto LAB_005c35af;
      if (pVVar3->pArray == (int *)0x0) {
        piVar5 = (int *)malloc((ulong)uVar2 << 3);
      }
      else {
        piVar5 = (int *)realloc(pVVar3->pArray,(ulong)uVar2 << 3);
      }
      pVVar3->pArray = piVar5;
    }
    if (piVar5 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    pVVar3->nCap = iVar6;
  }
LAB_005c35af:
  iVar6 = pVVar3->nSize;
  pVVar3->nSize = iVar6 + 1;
  pVVar3->pArray[iVar6] = uVar1;
LAB_005c35c5:
  ppBVar4 = p->pTable;
  pFunc->pNext = ppBVar4[pFunc->uSupp];
  ppBVar4[pFunc->uSupp] = pFunc;
  return;
}

Assistant:

void Bdc_TableAdd( Bdc_Man_t * p, Bdc_Fun_t * pFunc )
{
    if ( p->pTable[pFunc->uSupp] == NULL )
        Vec_IntPush( p->vSpots, pFunc->uSupp );
    pFunc->pNext = p->pTable[pFunc->uSupp];
    p->pTable[pFunc->uSupp] = pFunc;
}